

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O2

int write_data(spng_ctx *ctx,void *data,size_t bytes)

{
  size_t *psVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  
  if ((ctx->field_0xcc & 1) == 0) {
    iVar4 = require_bytes(ctx,bytes);
    if (iVar4 != 0) {
      ctx->state = SPNG_STATE_INVALID;
      return iVar4;
    }
    memcpy(ctx->write_ptr,data,bytes);
    ctx->write_ptr = ctx->write_ptr + bytes;
  }
  else {
    iVar4 = (*(code *)ctx->write_fn)(ctx,ctx->stream_user_ptr,data,bytes);
    if (iVar4 != 0) {
      iVar3 = -2;
      if (iVar4 == -1) {
        iVar3 = -1;
      }
      ctx->state = SPNG_STATE_INVALID;
      return iVar3;
    }
  }
  psVar1 = &ctx->bytes_encoded;
  uVar2 = *psVar1;
  *psVar1 = *psVar1 + bytes;
  return (uint)CARRY8(uVar2,bytes) * 3;
}

Assistant:

static int write_data(spng_ctx *ctx, const void *data, size_t bytes)
{
    if(ctx == NULL) return SPNG_EINTERNAL;
    if(!bytes) return 0;

    if(ctx->streaming)
    {
        if(bytes > SPNG_WRITE_SIZE) return SPNG_EINTERNAL;

        int ret = ctx->write_fn(ctx, ctx->stream_user_ptr, (void*)data, bytes);

        if(ret)
        {
            if(ret > 0 || ret < SPNG_IO_ERROR) ret = SPNG_IO_ERROR;

            return encode_err(ctx, ret);
        }
    }
    else
    {
        int ret = require_bytes(ctx, bytes);
        if(ret) return encode_err(ctx, ret);

        memcpy(ctx->write_ptr, data, bytes);

        ctx->write_ptr += bytes;
    }

    ctx->bytes_encoded += bytes;
    if(ctx->bytes_encoded < bytes) return SPNG_EOVERFLOW;

    return 0;
}